

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,Descriptor *descriptor,
          bool immutable,bool kotlin)

{
  byte bVar1;
  bool is_own_file;
  FileDescriptor *file;
  FileDescriptor *descriptor_00;
  string local_48;
  byte local_22;
  byte local_21;
  bool kotlin_local;
  Descriptor *pDStack_20;
  bool immutable_local;
  Descriptor *descriptor_local;
  ClassNameResolver *this_local;
  
  local_22 = kotlin;
  local_21 = immutable;
  pDStack_20 = descriptor;
  descriptor_local = (Descriptor *)this;
  this_local = (ClassNameResolver *)__return_storage_ptr__;
  (anonymous_namespace)::ClassNameWithoutPackage_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)descriptor,(Descriptor *)(ulong)(immutable & 1),
             immutable);
  file = Descriptor::file(pDStack_20);
  bVar1 = local_21;
  descriptor_00 = Descriptor::file(pDStack_20);
  is_own_file = MultipleJavaFiles(descriptor_00,(bool)(local_21 & 1));
  GetClassFullName(__return_storage_ptr__,this,&local_48,file,(bool)(bVar1 & 1),is_own_file,
                   (bool)(local_22 & 1));
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetClassName(const Descriptor* descriptor,
                                            bool immutable, bool kotlin) {
  return GetClassFullName(
      ClassNameWithoutPackage(descriptor, immutable), descriptor->file(),
      immutable, MultipleJavaFiles(descriptor->file(), immutable), kotlin);
}